

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Client::write_request(Client *this,Stream *strm,Request *req)

{
  Headers *headers;
  bool bVar1;
  int iVar2;
  string *psVar3;
  int iVar4;
  BufferStream bstrm;
  string length;
  pointer local_40;
  string path;
  
  bstrm.buffer._M_dataplus._M_p = (pointer)&bstrm.buffer.field_2;
  bstrm.super_Stream._vptr_Stream = (_func_int **)&PTR__BufferStream_001862e0;
  bstrm.buffer._M_string_length = 0;
  bstrm.buffer.field_2._M_local_buf[0] = '\0';
  detail::encode_url(&path,&req->path);
  length._M_dataplus._M_p = (req->method)._M_dataplus._M_p;
  local_40 = path._M_dataplus._M_p;
  Stream::write_format<char_const*,char_const*>
            (&bstrm.super_Stream,"%s %s HTTP/1.1\r\n",(char **)&length,&local_40);
  iVar2 = (*this->_vptr_Client[4])(this);
  iVar4 = 0x50;
  if ((char)iVar2 != '\0') {
    iVar4 = 0x1bb;
  }
  psVar3 = &this->host_and_port_;
  if (this->port_ == iVar4) {
    psVar3 = &this->host_;
  }
  Request::set_header(req,"Host",(psVar3->_M_dataplus)._M_p);
  headers = &req->headers;
  bVar1 = detail::has_header(headers,"Accept");
  if (!bVar1) {
    Request::set_header(req,"Accept","*/*");
  }
  bVar1 = detail::has_header(headers,"User-Agent");
  if (!bVar1) {
    Request::set_header(req,"User-Agent","cpp-httplib/0.2");
  }
  Request::set_header(req,"Connection","close");
  if ((req->body)._M_string_length == 0) {
    bVar1 = std::operator==(&req->method,"POST");
    if (!bVar1) {
      bVar1 = std::operator==(&req->method,"PUT");
      if (!bVar1) goto LAB_00161307;
    }
    Request::set_header(req,"Content-Length","0");
  }
  else {
    bVar1 = detail::has_header(headers,"Content-Type");
    if (!bVar1) {
      Request::set_header(req,"Content-Type","text/plain");
    }
    std::__cxx11::to_string(&length,(req->body)._M_string_length);
    Request::set_header(req,"Content-Length",length._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&length);
  }
LAB_00161307:
  detail::write_headers<httplib::Request>(&bstrm.super_Stream,req);
  if ((req->body)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&bstrm.buffer,(ulong)(req->body)._M_dataplus._M_p);
  }
  (*strm->_vptr_Stream[3])(strm,bstrm.buffer._M_dataplus._M_p,bstrm.buffer._M_string_length);
  std::__cxx11::string::~string((string *)&path);
  BufferStream::~BufferStream(&bstrm);
  return;
}

Assistant:

inline void Client::write_request(Stream& strm, Request& req)
{
    BufferStream bstrm;

    // Request line
    auto path = detail::encode_url(req.path);

    bstrm.write_format("%s %s HTTP/1.1\r\n",
        req.method.c_str(),
        path.c_str());

    // Headers
    if (is_ssl()) {
        if (port_ == 443) {
            req.set_header("Host", host_.c_str());
        } else {
            req.set_header("Host", host_and_port_.c_str());
        }
    } else {
        if (port_ == 80) {
            req.set_header("Host", host_.c_str());
        } else {
            req.set_header("Host", host_and_port_.c_str());
        }
    }

    if (!req.has_header("Accept")) {
        req.set_header("Accept", "*/*");
    }

    if (!req.has_header("User-Agent")) {
        req.set_header("User-Agent", "cpp-httplib/0.2");
    }

    // TODO: Support KeepAlive connection
    // if (!req.has_header("Connection")) {
        req.set_header("Connection", "close");
    // }

    if (req.body.empty()) {
        if (req.method == "POST" || req.method == "PUT") {
            req.set_header("Content-Length", "0");
        }
    } else {
        if (!req.has_header("Content-Type")) {
            req.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(req.body.size());
        req.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(bstrm, req);

    // Body
    if (!req.body.empty()) {
        bstrm.write(req.body.c_str(), req.body.size());
    }

    // Flush buffer
    auto& data = bstrm.get_buffer();
    strm.write(data.data(), data.size());
}